

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemTxResult
flatview_read_continue_mips
          (uc_struct_conflict4 *uc,FlatView *fv,hwaddr addr,MemTxAttrs attrs,void *ptr,hwaddr len,
          hwaddr addr1,hwaddr l,MemoryRegion *mr)

{
  hwaddr hVar1;
  uint uVar2;
  MemTxResult MVar3;
  void *__src;
  MemoryRegion *mr_00;
  uc_struct_conflict4 *uc_00;
  MemOp_conflict1 op;
  uint uVar4;
  uc_struct_conflict4 *__dest;
  uint64_t val;
  
  uVar4 = 0;
  mr_00 = mr;
  __dest = (uc_struct_conflict4 *)ptr;
  while( true ) {
    hVar1 = addr1;
    if (mr_00->ram == false) {
      uVar2 = memory_access_size(mr_00,(uint)l,addr1);
      l = (hwaddr)(int)uVar2;
      op = MO_ALIGN_4;
      if ((uVar2 != 0) && (op = MO_8, uVar2 != 0)) {
        for (; (uVar2 >> op & 1) == 0; op = op + MO_16) {
        }
      }
      uc_00 = uc;
      MVar3 = memory_region_dispatch_read_mips(uc,mr_00,hVar1,&val,op,attrs);
      uVar4 = MVar3 | uVar4;
      switch((int)l) {
      case 1:
        *(char *)&__dest->arch = (char)val;
        break;
      case 2:
        *(short *)&__dest->arch = (short)val;
        break;
      case 4:
        __dest->arch = (uc_arch)val;
        break;
      case 8:
        __dest->arch = (undefined4)val;
        __dest->mode = val._4_4_;
      }
    }
    else {
      __src = qemu_ram_ptr_length((uc_struct_conflict4 *)fv->root->uc,mr_00->ram_block,addr1,&l,
                                  SUB81(ptr,0));
      hVar1 = l;
      uc_00 = __dest;
      memcpy(__dest,__src,l);
      l = hVar1;
    }
    len = len - l;
    if (len == 0) break;
    addr = addr + l;
    __dest = (uc_struct_conflict4 *)((long)&__dest->arch + l);
    ptr = &l;
    l = len;
    mr_00 = flatview_translate_mips(uc_00,fv,addr,&addr1,(hwaddr *)ptr,false,attrs);
  }
  return uVar4;
}

Assistant:

MemTxResult flatview_read_continue(struct uc_struct *uc, FlatView *fv, hwaddr addr,
                                   MemTxAttrs attrs, void *ptr,
                                   hwaddr len, hwaddr addr1, hwaddr l,
                                   MemoryRegion *mr)
{
    uint8_t *ram_ptr;
    uint64_t val;
    MemTxResult result = MEMTX_OK;
    bool release_lock = false;
    uint8_t *buf = ptr;

    for (;;) {
        if (!memory_access_is_direct(mr, false)) {
            /* I/O case */
            release_lock |= prepare_mmio_access(mr);
            l = memory_access_size(mr, l, addr1);
            result |= memory_region_dispatch_read(uc, mr, addr1, &val,
                                                  size_memop(l), attrs);
            stn_he_p(buf, l, val);
        } else {
            /* RAM case */
            ram_ptr = qemu_ram_ptr_length(fv->root->uc, mr->ram_block, addr1, &l, false);
            memcpy(buf, ram_ptr, l);
        }

        if (release_lock) {
            release_lock = false;
        }

        len -= l;
        buf += l;
        addr += l;

        if (!len) {
            break;
        }

        l = len;
        mr = flatview_translate(uc, fv, addr, &addr1, &l, false, attrs);
    }

    return result;
}